

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::StyleColorsDark(ImGuiStyle *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImVec4 *lhs;
  ImVec4 IVar4;
  ImGuiStyle *local_388;
  ImVec4 local_380;
  ImVec4 local_370;
  ImVec4 local_360;
  ImVec4 local_350;
  ImVec4 local_340;
  ImVec4 local_330;
  ImVec4 local_320;
  ImVec4 local_310;
  ImVec4 local_300;
  ImVec4 local_2f0;
  ImVec4 local_2e0;
  ImVec4 local_2d0;
  ImVec4 local_2c0;
  ImVec4 local_2b0;
  ImVec4 local_2a0;
  ImVec4 local_290;
  ImVec4 local_280;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  ImVec4 local_220;
  ImVec4 local_210;
  ImVec4 local_200;
  ImVec4 local_1f0;
  ImVec4 local_1e0;
  ImVec4 local_1d0;
  ImVec4 local_1c0;
  ImVec4 local_1b0;
  ImVec4 local_1a0;
  ImVec4 local_190;
  ImVec4 local_180;
  ImVec4 local_170;
  ImVec4 local_160;
  ImVec4 local_150;
  ImVec4 local_140;
  ImVec4 local_130;
  ImVec4 local_120;
  ImVec4 local_110;
  ImVec4 local_100;
  ImVec4 local_f0;
  ImVec4 local_e0;
  ImVec4 local_d0;
  ImVec4 local_c0;
  ImVec4 local_b0;
  ImVec4 local_a0;
  ImVec4 local_90;
  ImVec4 local_80;
  ImVec4 local_70;
  ImVec4 local_60;
  ImVec4 local_50;
  ImVec4 local_40;
  ImVec4 local_30;
  ImVec4 *local_20;
  ImVec4 *colors;
  ImGuiStyle *style;
  ImGuiStyle *dst_local;
  
  local_388 = dst;
  style = dst;
  if (dst == (ImGuiStyle *)0x0) {
    local_388 = GetStyle();
  }
  colors = (ImVec4 *)local_388;
  local_20 = local_388->Colors;
  ImVec4::ImVec4(&local_30,1.0,1.0,1.0,1.0);
  local_20->x = local_30.x;
  local_20->y = local_30.y;
  local_20->z = local_30.z;
  local_20->w = local_30.w;
  ImVec4::ImVec4(&local_40,0.5,0.5,0.5,1.0);
  local_20[1].x = local_40.x;
  local_20[1].y = local_40.y;
  local_20[1].z = local_40.z;
  local_20[1].w = local_40.w;
  ImVec4::ImVec4(&local_50,0.06,0.06,0.06,0.94);
  local_20[2].x = local_50.x;
  local_20[2].y = local_50.y;
  local_20[2].z = local_50.z;
  local_20[2].w = local_50.w;
  ImVec4::ImVec4(&local_60,0.0,0.0,0.0,0.0);
  local_20[3].x = local_60.x;
  local_20[3].y = local_60.y;
  local_20[3].z = local_60.z;
  local_20[3].w = local_60.w;
  ImVec4::ImVec4(&local_70,0.08,0.08,0.08,0.94);
  local_20[4].x = local_70.x;
  local_20[4].y = local_70.y;
  local_20[4].z = local_70.z;
  local_20[4].w = local_70.w;
  ImVec4::ImVec4(&local_80,0.43,0.43,0.5,0.5);
  local_20[5].x = local_80.x;
  local_20[5].y = local_80.y;
  local_20[5].z = local_80.z;
  local_20[5].w = local_80.w;
  ImVec4::ImVec4(&local_90,0.0,0.0,0.0,0.0);
  local_20[6].x = local_90.x;
  local_20[6].y = local_90.y;
  local_20[6].z = local_90.z;
  local_20[6].w = local_90.w;
  ImVec4::ImVec4(&local_a0,0.16,0.29,0.48,0.54);
  local_20[7].x = local_a0.x;
  local_20[7].y = local_a0.y;
  local_20[7].z = local_a0.z;
  local_20[7].w = local_a0.w;
  ImVec4::ImVec4(&local_b0,0.26,0.59,0.98,0.4);
  local_20[8].x = local_b0.x;
  local_20[8].y = local_b0.y;
  local_20[8].z = local_b0.z;
  local_20[8].w = local_b0.w;
  ImVec4::ImVec4(&local_c0,0.26,0.59,0.98,0.67);
  local_20[9].x = local_c0.x;
  local_20[9].y = local_c0.y;
  local_20[9].z = local_c0.z;
  local_20[9].w = local_c0.w;
  ImVec4::ImVec4(&local_d0,0.04,0.04,0.04,1.0);
  local_20[10].x = local_d0.x;
  local_20[10].y = local_d0.y;
  local_20[10].z = local_d0.z;
  local_20[10].w = local_d0.w;
  ImVec4::ImVec4(&local_e0,0.16,0.29,0.48,1.0);
  local_20[0xb].x = local_e0.x;
  local_20[0xb].y = local_e0.y;
  local_20[0xb].z = local_e0.z;
  local_20[0xb].w = local_e0.w;
  ImVec4::ImVec4(&local_f0,0.0,0.0,0.0,0.51);
  local_20[0xc].x = local_f0.x;
  local_20[0xc].y = local_f0.y;
  local_20[0xc].z = local_f0.z;
  local_20[0xc].w = local_f0.w;
  ImVec4::ImVec4(&local_100,0.14,0.14,0.14,1.0);
  local_20[0xd].x = local_100.x;
  local_20[0xd].y = local_100.y;
  local_20[0xd].z = local_100.z;
  local_20[0xd].w = local_100.w;
  ImVec4::ImVec4(&local_110,0.02,0.02,0.02,0.53);
  local_20[0xe].x = local_110.x;
  local_20[0xe].y = local_110.y;
  local_20[0xe].z = local_110.z;
  local_20[0xe].w = local_110.w;
  ImVec4::ImVec4(&local_120,0.31,0.31,0.31,1.0);
  local_20[0xf].x = local_120.x;
  local_20[0xf].y = local_120.y;
  local_20[0xf].z = local_120.z;
  local_20[0xf].w = local_120.w;
  ImVec4::ImVec4(&local_130,0.41,0.41,0.41,1.0);
  local_20[0x10].x = local_130.x;
  local_20[0x10].y = local_130.y;
  local_20[0x10].z = local_130.z;
  local_20[0x10].w = local_130.w;
  ImVec4::ImVec4(&local_140,0.51,0.51,0.51,1.0);
  local_20[0x11].x = local_140.x;
  local_20[0x11].y = local_140.y;
  local_20[0x11].z = local_140.z;
  local_20[0x11].w = local_140.w;
  ImVec4::ImVec4(&local_150,0.26,0.59,0.98,1.0);
  local_20[0x12].x = local_150.x;
  local_20[0x12].y = local_150.y;
  local_20[0x12].z = local_150.z;
  local_20[0x12].w = local_150.w;
  ImVec4::ImVec4(&local_160,0.24,0.52,0.88,1.0);
  local_20[0x13].x = local_160.x;
  local_20[0x13].y = local_160.y;
  local_20[0x13].z = local_160.z;
  local_20[0x13].w = local_160.w;
  ImVec4::ImVec4(&local_170,0.26,0.59,0.98,1.0);
  local_20[0x14].x = local_170.x;
  local_20[0x14].y = local_170.y;
  local_20[0x14].z = local_170.z;
  local_20[0x14].w = local_170.w;
  ImVec4::ImVec4(&local_180,0.26,0.59,0.98,0.4);
  local_20[0x15].x = local_180.x;
  local_20[0x15].y = local_180.y;
  local_20[0x15].z = local_180.z;
  local_20[0x15].w = local_180.w;
  ImVec4::ImVec4(&local_190,0.26,0.59,0.98,1.0);
  local_20[0x16].x = local_190.x;
  local_20[0x16].y = local_190.y;
  local_20[0x16].z = local_190.z;
  local_20[0x16].w = local_190.w;
  ImVec4::ImVec4(&local_1a0,0.06,0.53,0.98,1.0);
  local_20[0x17].x = local_1a0.x;
  local_20[0x17].y = local_1a0.y;
  local_20[0x17].z = local_1a0.z;
  local_20[0x17].w = local_1a0.w;
  ImVec4::ImVec4(&local_1b0,0.26,0.59,0.98,0.31);
  local_20[0x18].x = local_1b0.x;
  local_20[0x18].y = local_1b0.y;
  local_20[0x18].z = local_1b0.z;
  local_20[0x18].w = local_1b0.w;
  ImVec4::ImVec4(&local_1c0,0.26,0.59,0.98,0.8);
  local_20[0x19].x = local_1c0.x;
  local_20[0x19].y = local_1c0.y;
  local_20[0x19].z = local_1c0.z;
  local_20[0x19].w = local_1c0.w;
  ImVec4::ImVec4(&local_1d0,0.26,0.59,0.98,1.0);
  local_20[0x1a].x = local_1d0.x;
  local_20[0x1a].y = local_1d0.y;
  local_20[0x1a].z = local_1d0.z;
  local_20[0x1a].w = local_1d0.w;
  fVar1 = local_20[5].y;
  fVar2 = local_20[5].z;
  fVar3 = local_20[5].w;
  local_20[0x1b].x = local_20[5].x;
  local_20[0x1b].y = fVar1;
  local_20[0x1b].z = fVar2;
  local_20[0x1b].w = fVar3;
  ImVec4::ImVec4(&local_1e0,0.1,0.4,0.75,0.78);
  local_20[0x1c].x = local_1e0.x;
  local_20[0x1c].y = local_1e0.y;
  local_20[0x1c].z = local_1e0.z;
  local_20[0x1c].w = local_1e0.w;
  ImVec4::ImVec4(&local_1f0,0.1,0.4,0.75,1.0);
  local_20[0x1d].x = local_1f0.x;
  local_20[0x1d].y = local_1f0.y;
  local_20[0x1d].z = local_1f0.z;
  local_20[0x1d].w = local_1f0.w;
  ImVec4::ImVec4(&local_200,0.26,0.59,0.98,0.2);
  local_20[0x1e].x = local_200.x;
  local_20[0x1e].y = local_200.y;
  local_20[0x1e].z = local_200.z;
  local_20[0x1e].w = local_200.w;
  ImVec4::ImVec4(&local_210,0.26,0.59,0.98,0.67);
  local_20[0x1f].x = local_210.x;
  local_20[0x1f].y = local_210.y;
  local_20[0x1f].z = local_210.z;
  local_20[0x1f].w = local_210.w;
  ImVec4::ImVec4(&local_220,0.26,0.59,0.98,0.95);
  local_20[0x20].x = local_220.x;
  local_20[0x20].y = local_220.y;
  local_20[0x20].z = local_220.z;
  local_20[0x20].w = local_220.w;
  IVar4 = ImLerp(local_20 + 0x18,local_20 + 0xb,0.8);
  local_230 = IVar4._0_8_;
  uStack_228 = IVar4._8_8_;
  local_20[0x21].x = (float)(int)local_230;
  local_20[0x21].y = (float)(int)((ulong)local_230 >> 0x20);
  local_20[0x21].z = (float)(int)uStack_228;
  local_20[0x21].w = (float)(int)((ulong)uStack_228 >> 0x20);
  fVar1 = local_20[0x19].y;
  fVar2 = local_20[0x19].z;
  fVar3 = local_20[0x19].w;
  local_20[0x22].x = local_20[0x19].x;
  local_20[0x22].y = fVar1;
  local_20[0x22].z = fVar2;
  local_20[0x22].w = fVar3;
  IVar4 = ImLerp(local_20 + 0x1a,local_20 + 0xb,0.6);
  local_240 = IVar4._0_8_;
  uStack_238 = IVar4._8_8_;
  local_20[0x23].x = (float)(int)local_240;
  local_20[0x23].y = (float)(int)((ulong)local_240 >> 0x20);
  local_20[0x23].z = (float)(int)uStack_238;
  local_20[0x23].w = (float)(int)((ulong)uStack_238 >> 0x20);
  IVar4 = ImLerp(local_20 + 0x21,local_20 + 10,0.8);
  local_250 = IVar4._0_8_;
  uStack_248 = IVar4._8_8_;
  local_20[0x24].x = (float)(int)local_250;
  local_20[0x24].y = (float)(int)((ulong)local_250 >> 0x20);
  local_20[0x24].z = (float)(int)uStack_248;
  local_20[0x24].w = (float)(int)((ulong)uStack_248 >> 0x20);
  IVar4 = ImLerp(local_20 + 0x23,local_20 + 10,0.4);
  local_260 = IVar4._0_8_;
  uStack_258 = IVar4._8_8_;
  local_20[0x25].x = (float)(int)local_260;
  local_20[0x25].y = (float)(int)((ulong)local_260 >> 0x20);
  local_20[0x25].z = (float)(int)uStack_258;
  local_20[0x25].w = (float)(int)((ulong)uStack_258 >> 0x20);
  lhs = local_20 + 0x1a;
  ImVec4::ImVec4(&local_280,1.0,1.0,1.0,0.7);
  IVar4 = operator*(lhs,&local_280);
  local_270 = IVar4._0_8_;
  local_268 = IVar4._8_8_;
  local_20[0x26].x = (float)(int)local_270;
  local_20[0x26].y = (float)(int)((ulong)local_270 >> 0x20);
  local_20[0x26].z = (float)(int)local_268;
  local_20[0x26].w = (float)(int)((ulong)local_268 >> 0x20);
  ImVec4::ImVec4(&local_290,0.2,0.2,0.2,1.0);
  local_20[0x27].x = local_290.x;
  local_20[0x27].y = local_290.y;
  local_20[0x27].z = local_290.z;
  local_20[0x27].w = local_290.w;
  ImVec4::ImVec4(&local_2a0,0.61,0.61,0.61,1.0);
  local_20[0x28].x = local_2a0.x;
  local_20[0x28].y = local_2a0.y;
  local_20[0x28].z = local_2a0.z;
  local_20[0x28].w = local_2a0.w;
  ImVec4::ImVec4(&local_2b0,1.0,0.43,0.35,1.0);
  local_20[0x29].x = local_2b0.x;
  local_20[0x29].y = local_2b0.y;
  local_20[0x29].z = local_2b0.z;
  local_20[0x29].w = local_2b0.w;
  ImVec4::ImVec4(&local_2c0,0.9,0.7,0.0,1.0);
  local_20[0x2a].x = local_2c0.x;
  local_20[0x2a].y = local_2c0.y;
  local_20[0x2a].z = local_2c0.z;
  local_20[0x2a].w = local_2c0.w;
  ImVec4::ImVec4(&local_2d0,1.0,0.6,0.0,1.0);
  local_20[0x2b].x = local_2d0.x;
  local_20[0x2b].y = local_2d0.y;
  local_20[0x2b].z = local_2d0.z;
  local_20[0x2b].w = local_2d0.w;
  ImVec4::ImVec4(&local_2e0,0.19,0.19,0.2,1.0);
  local_20[0x2c].x = local_2e0.x;
  local_20[0x2c].y = local_2e0.y;
  local_20[0x2c].z = local_2e0.z;
  local_20[0x2c].w = local_2e0.w;
  ImVec4::ImVec4(&local_2f0,0.31,0.31,0.35,1.0);
  local_20[0x2d].x = local_2f0.x;
  local_20[0x2d].y = local_2f0.y;
  local_20[0x2d].z = local_2f0.z;
  local_20[0x2d].w = local_2f0.w;
  ImVec4::ImVec4(&local_300,0.23,0.23,0.25,1.0);
  local_20[0x2e].x = local_300.x;
  local_20[0x2e].y = local_300.y;
  local_20[0x2e].z = local_300.z;
  local_20[0x2e].w = local_300.w;
  ImVec4::ImVec4(&local_310,0.0,0.0,0.0,0.0);
  local_20[0x2f].x = local_310.x;
  local_20[0x2f].y = local_310.y;
  local_20[0x2f].z = local_310.z;
  local_20[0x2f].w = local_310.w;
  ImVec4::ImVec4(&local_320,1.0,1.0,1.0,0.06);
  local_20[0x30].x = local_320.x;
  local_20[0x30].y = local_320.y;
  local_20[0x30].z = local_320.z;
  local_20[0x30].w = local_320.w;
  ImVec4::ImVec4(&local_330,0.26,0.59,0.98,0.35);
  local_20[0x31].x = local_330.x;
  local_20[0x31].y = local_330.y;
  local_20[0x31].z = local_330.z;
  local_20[0x31].w = local_330.w;
  ImVec4::ImVec4(&local_340,1.0,1.0,0.0,0.9);
  local_20[0x32].x = local_340.x;
  local_20[0x32].y = local_340.y;
  local_20[0x32].z = local_340.z;
  local_20[0x32].w = local_340.w;
  ImVec4::ImVec4(&local_350,0.26,0.59,0.98,1.0);
  local_20[0x33].x = local_350.x;
  local_20[0x33].y = local_350.y;
  local_20[0x33].z = local_350.z;
  local_20[0x33].w = local_350.w;
  ImVec4::ImVec4(&local_360,1.0,1.0,1.0,0.7);
  local_20[0x34].x = local_360.x;
  local_20[0x34].y = local_360.y;
  local_20[0x34].z = local_360.z;
  local_20[0x34].w = local_360.w;
  ImVec4::ImVec4(&local_370,0.8,0.8,0.8,0.2);
  local_20[0x35].x = local_370.x;
  local_20[0x35].y = local_370.y;
  local_20[0x35].z = local_370.z;
  local_20[0x35].w = local_370.w;
  ImVec4::ImVec4(&local_380,0.8,0.8,0.8,0.35);
  local_20[0x36].x = local_380.x;
  local_20[0x36].y = local_380.y;
  local_20[0x36].z = local_380.z;
  local_20[0x36].w = local_380.w;
  return;
}

Assistant:

void ImGui::StyleColorsDark(ImGuiStyle* dst)
{
    ImGuiStyle* style = dst ? dst : &ImGui::GetStyle();
    ImVec4* colors = style->Colors;

    colors[ImGuiCol_Text]                   = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    colors[ImGuiCol_TextDisabled]           = ImVec4(0.50f, 0.50f, 0.50f, 1.00f);
    colors[ImGuiCol_WindowBg]               = ImVec4(0.06f, 0.06f, 0.06f, 0.94f);
    colors[ImGuiCol_ChildBg]                = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_PopupBg]                = ImVec4(0.08f, 0.08f, 0.08f, 0.94f);
    colors[ImGuiCol_Border]                 = ImVec4(0.43f, 0.43f, 0.50f, 0.50f);
    colors[ImGuiCol_BorderShadow]           = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_FrameBg]                = ImVec4(0.16f, 0.29f, 0.48f, 0.54f);
    colors[ImGuiCol_FrameBgHovered]         = ImVec4(0.26f, 0.59f, 0.98f, 0.40f);
    colors[ImGuiCol_FrameBgActive]          = ImVec4(0.26f, 0.59f, 0.98f, 0.67f);
    colors[ImGuiCol_TitleBg]                = ImVec4(0.04f, 0.04f, 0.04f, 1.00f);
    colors[ImGuiCol_TitleBgActive]          = ImVec4(0.16f, 0.29f, 0.48f, 1.00f);
    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.00f, 0.00f, 0.00f, 0.51f);
    colors[ImGuiCol_MenuBarBg]              = ImVec4(0.14f, 0.14f, 0.14f, 1.00f);
    colors[ImGuiCol_ScrollbarBg]            = ImVec4(0.02f, 0.02f, 0.02f, 0.53f);
    colors[ImGuiCol_ScrollbarGrab]          = ImVec4(0.31f, 0.31f, 0.31f, 1.00f);
    colors[ImGuiCol_ScrollbarGrabHovered]   = ImVec4(0.41f, 0.41f, 0.41f, 1.00f);
    colors[ImGuiCol_ScrollbarGrabActive]    = ImVec4(0.51f, 0.51f, 0.51f, 1.00f);
    colors[ImGuiCol_CheckMark]              = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_SliderGrab]             = ImVec4(0.24f, 0.52f, 0.88f, 1.00f);
    colors[ImGuiCol_SliderGrabActive]       = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_Button]                 = ImVec4(0.26f, 0.59f, 0.98f, 0.40f);
    colors[ImGuiCol_ButtonHovered]          = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_ButtonActive]           = ImVec4(0.06f, 0.53f, 0.98f, 1.00f);
    colors[ImGuiCol_Header]                 = ImVec4(0.26f, 0.59f, 0.98f, 0.31f);
    colors[ImGuiCol_HeaderHovered]          = ImVec4(0.26f, 0.59f, 0.98f, 0.80f);
    colors[ImGuiCol_HeaderActive]           = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_Separator]              = colors[ImGuiCol_Border];
    colors[ImGuiCol_SeparatorHovered]       = ImVec4(0.10f, 0.40f, 0.75f, 0.78f);
    colors[ImGuiCol_SeparatorActive]        = ImVec4(0.10f, 0.40f, 0.75f, 1.00f);
    colors[ImGuiCol_ResizeGrip]             = ImVec4(0.26f, 0.59f, 0.98f, 0.20f);
    colors[ImGuiCol_ResizeGripHovered]      = ImVec4(0.26f, 0.59f, 0.98f, 0.67f);
    colors[ImGuiCol_ResizeGripActive]       = ImVec4(0.26f, 0.59f, 0.98f, 0.95f);
    colors[ImGuiCol_Tab]                    = ImLerp(colors[ImGuiCol_Header],       colors[ImGuiCol_TitleBgActive], 0.80f);
    colors[ImGuiCol_TabHovered]             = colors[ImGuiCol_HeaderHovered];
    colors[ImGuiCol_TabActive]              = ImLerp(colors[ImGuiCol_HeaderActive], colors[ImGuiCol_TitleBgActive], 0.60f);
    colors[ImGuiCol_TabUnfocused]           = ImLerp(colors[ImGuiCol_Tab],          colors[ImGuiCol_TitleBg], 0.80f);
    colors[ImGuiCol_TabUnfocusedActive]     = ImLerp(colors[ImGuiCol_TabActive],    colors[ImGuiCol_TitleBg], 0.40f);
    colors[ImGuiCol_DockingPreview]         = colors[ImGuiCol_HeaderActive] * ImVec4(1.0f, 1.0f, 1.0f, 0.7f);
    colors[ImGuiCol_DockingEmptyBg]         = ImVec4(0.20f, 0.20f, 0.20f, 1.00f);
    colors[ImGuiCol_PlotLines]              = ImVec4(0.61f, 0.61f, 0.61f, 1.00f);
    colors[ImGuiCol_PlotLinesHovered]       = ImVec4(1.00f, 0.43f, 0.35f, 1.00f);
    colors[ImGuiCol_PlotHistogram]          = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
    colors[ImGuiCol_PlotHistogramHovered]   = ImVec4(1.00f, 0.60f, 0.00f, 1.00f);
    colors[ImGuiCol_TableHeaderBg]          = ImVec4(0.19f, 0.19f, 0.20f, 1.00f);
    colors[ImGuiCol_TableBorderStrong]      = ImVec4(0.31f, 0.31f, 0.35f, 1.00f);   // Prefer using Alpha=1.0 here
    colors[ImGuiCol_TableBorderLight]       = ImVec4(0.23f, 0.23f, 0.25f, 1.00f);   // Prefer using Alpha=1.0 here
    colors[ImGuiCol_TableRowBg]             = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_TableRowBgAlt]          = ImVec4(1.00f, 1.00f, 1.00f, 0.06f);
    colors[ImGuiCol_TextSelectedBg]         = ImVec4(0.26f, 0.59f, 0.98f, 0.35f);
    colors[ImGuiCol_DragDropTarget]         = ImVec4(1.00f, 1.00f, 0.00f, 0.90f);
    colors[ImGuiCol_NavHighlight]           = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_NavWindowingHighlight]  = ImVec4(1.00f, 1.00f, 1.00f, 0.70f);
    colors[ImGuiCol_NavWindowingDimBg]      = ImVec4(0.80f, 0.80f, 0.80f, 0.20f);
    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.80f, 0.80f, 0.80f, 0.35f);
}